

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O3

vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
* __thiscall
kratos::VarSlice::get_slice_index
          (vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           *__return_storage_ptr__,VarSlice *this)

{
  pair<unsigned_int,_unsigned_int> local_20;
  
  (*(this->parent_var->super_IRNode)._vptr_IRNode[0x24])();
  local_20.second = this->low;
  local_20.first = this->high;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::emplace_back<std::pair<unsigned_int,unsigned_int>>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)__return_storage_ptr__,&local_20);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<uint32_t, uint32_t>> VarSlice::get_slice_index() const {
    std::vector<std::pair<uint32_t, uint32_t>> result = parent_var->get_slice_index();
    result.emplace_back(std::make_pair(high, low));
    return result;
}